

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O2

bool __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::operator!=
          (InputParameter<3UL,_ruckig::StandardVector> *this,
          InputParameter<3UL,_ruckig::StandardVector> *rhs)

{
  double dVar1;
  bool bVar2;
  bool bVar3;
  __optional_eq_t<std::vector<std::array<double,_3UL>_>,_std::vector<std::array<double,_3UL>_>_>
  _Var4;
  __optional_eq_t<std::array<double,_3UL>,_std::array<double,_3UL>_> _Var5;
  __optional_eq_t<std::vector<double>,_std::vector<double>_> _Var6;
  __optional_eq_t<std::array<ruckig::ControlInterface,_3UL>,_std::array<ruckig::ControlInterface,_3UL>_>
  _Var7;
  __optional_eq_t<std::array<ruckig::Synchronization,_3UL>,_std::array<ruckig::Synchronization,_3UL>_>
  _Var8;
  bool bVar9;
  
  bVar3 = std::operator==(&this->current_position,&rhs->current_position);
  bVar9 = true;
  if (((((bVar3) && (bVar3 = std::operator==(&this->current_velocity,&rhs->current_velocity), bVar3)
        ) && (bVar3 = std::operator==(&this->current_acceleration,&rhs->current_acceleration), bVar3
             )) &&
      (((bVar3 = std::operator==(&this->target_position,&rhs->target_position), bVar3 &&
        (bVar3 = std::operator==(&this->target_velocity,&rhs->target_velocity), bVar3)) &&
       ((bVar3 = std::operator==(&this->target_acceleration,&rhs->target_acceleration), bVar3 &&
        ((bVar3 = std::operator==(&this->max_velocity,&rhs->max_velocity), bVar3 &&
         (bVar3 = std::operator==(&this->max_acceleration,&rhs->max_acceleration), bVar3)))))))) &&
     (((bVar3 = std::operator==(&this->max_jerk,&rhs->max_jerk), bVar3 &&
       ((((bVar3 = std::operator==(&this->intermediate_positions,&rhs->intermediate_positions),
          bVar3 && (_Var4 = std::operator==(&this->per_section_max_velocity,
                                            &rhs->per_section_max_velocity), _Var4)) &&
         (_Var4 = std::operator==(&this->per_section_max_acceleration,
                                  &rhs->per_section_max_acceleration), _Var4)) &&
        ((_Var4 = std::operator==(&this->per_section_max_jerk,&rhs->per_section_max_jerk), _Var4 &&
         (_Var4 = std::operator==(&this->per_section_min_velocity,&rhs->per_section_min_velocity),
         _Var4)))))) &&
      ((((_Var4 = std::operator==(&this->per_section_min_acceleration,
                                  &rhs->per_section_min_acceleration), _Var4 &&
         ((_Var4 = std::operator==(&this->per_section_max_position,&rhs->per_section_max_position),
          _Var4 && (_Var4 = std::operator==(&this->per_section_min_position,
                                            &rhs->per_section_min_position), _Var4)))) &&
        (_Var5 = std::operator==(&this->max_position,&rhs->max_position), _Var5)) &&
       ((_Var5 = std::operator==(&this->min_position,&rhs->min_position), _Var5 &&
        (bVar3 = std::operator==(&this->enabled,&rhs->enabled), bVar3)))))))) {
    bVar3 = (this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_engaged;
    bVar2 = (rhs->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
            super__Optional_payload_base<double>._M_engaged;
    if (bVar3 == bVar2 && bVar3 == true) {
      dVar1 = (this->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_payload._M_value;
      if (dVar1 != (rhs->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
                   super__Optional_payload_base<double>._M_payload._M_value) {
        return true;
      }
      if (NAN(dVar1) ||
          NAN((rhs->minimum_duration).super__Optional_base<double,_true,_true>._M_payload.
              super__Optional_payload_base<double>._M_payload._M_value)) {
        return true;
      }
    }
    else if (bVar3 != bVar2) {
      return true;
    }
    _Var6 = std::operator==(&this->per_section_minimum_duration,&rhs->per_section_minimum_duration);
    if ((((_Var6) && (_Var5 = std::operator==(&this->min_velocity,&rhs->min_velocity), _Var5)) &&
        (_Var5 = std::operator==(&this->min_acceleration,&rhs->min_acceleration), _Var5)) &&
       (((this->control_interface == rhs->control_interface &&
         (this->synchronization == rhs->synchronization)) &&
        ((this->duration_discretization == rhs->duration_discretization &&
         (_Var7 = std::operator==(&this->per_dof_control_interface,&rhs->per_dof_control_interface),
         _Var7)))))) {
      _Var8 = std::operator==(&this->per_dof_synchronization,&rhs->per_dof_synchronization);
      bVar9 = !_Var8;
    }
  }
  return bVar9;
}

Assistant:

bool operator!=(const InputParameter<DOFs, CustomVector>& rhs) const {
        return !(
            current_position == rhs.current_position
            && current_velocity == rhs.current_velocity
            && current_acceleration == rhs.current_acceleration
            && target_position == rhs.target_position
            && target_velocity == rhs.target_velocity
            && target_acceleration == rhs.target_acceleration
            && max_velocity == rhs.max_velocity
            && max_acceleration == rhs.max_acceleration
            && max_jerk == rhs.max_jerk
            && intermediate_positions == rhs.intermediate_positions
            && per_section_max_velocity == rhs.per_section_max_velocity
            && per_section_max_acceleration == rhs.per_section_max_acceleration
            && per_section_max_jerk == rhs.per_section_max_jerk
            && per_section_min_velocity == rhs.per_section_min_velocity
            && per_section_min_acceleration == rhs.per_section_min_acceleration
            && per_section_max_position == rhs.per_section_max_position
            && per_section_min_position == rhs.per_section_min_position
            && max_position == rhs.max_position
            && min_position == rhs.min_position
            && enabled == rhs.enabled
            && minimum_duration == rhs.minimum_duration
            && per_section_minimum_duration == rhs.per_section_minimum_duration
            && min_velocity == rhs.min_velocity
            && min_acceleration == rhs.min_acceleration
            && control_interface == rhs.control_interface
            && synchronization == rhs.synchronization
            && duration_discretization == rhs.duration_discretization
            && per_dof_control_interface == rhs.per_dof_control_interface
            && per_dof_synchronization == rhs.per_dof_synchronization
        );
    }